

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O1

bool bgp_update(bgp_peer *peer,uchar *buff,int entire_length)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint8_t prefix_len_00;
  ushort unfeasible_routes_length;
  ushort total_path_attribute_length;
  node<adj_ribs_in_data> *pnVar4;
  long lVar5;
  int iVar6;
  adj_ribs_in_data *paVar7;
  undefined8 *puVar8;
  uint32_t prefix;
  int iVar9;
  byte bVar10;
  int prefix_len;
  bool is_updated;
  adj_ribs_in_data route_data;
  adj_ribs_in_data in_stack_fffffffffffffd88;
  uint local_158;
  int local_154;
  char *local_150;
  adj_ribs_in_data local_148;
  
  bVar10 = 0;
  unfeasible_routes_length = *(ushort *)(buff + 0x13) << 8 | *(ushort *)(buff + 0x13) >> 8;
  local_154 = entire_length;
  bgp_update_handle_unfeasible_prefix(peer,buff,unfeasible_routes_length);
  local_148.path_attr.origin = '\0';
  local_148.path_attr.as_path_length = '\0';
  memset(local_148.path_attr.as_path,0,0x114);
  total_path_attribute_length =
       *(ushort *)(buff + (ulong)unfeasible_routes_length + 0x15) << 8 |
       *(ushort *)(buff + (ulong)unfeasible_routes_length + 0x15) >> 8;
  bgp_update_handle_path_attribute
            (peer,buff,unfeasible_routes_length,total_path_attribute_length,&local_148);
  iVar9 = (uint)total_path_attribute_length + (uint)unfeasible_routes_length + 0x17;
  do {
    if (local_154 <= iVar9) {
      return true;
    }
    bVar1 = buff[iVar9];
    local_158 = (uint)bVar1;
    if (local_158 < 9) {
      prefix = (uint)buff[(long)iVar9 + 1] << 0x18;
      iVar6 = 2;
LAB_00112803:
      local_150 = inet_ntoa((in_addr)(prefix >> 0x18 | (prefix & 0xff0000) >> 8 |
                                      (prefix & 0xff00) << 8 | prefix << 0x18));
      log<char*,int>(DEBUG,"%s/%d",&local_150,(int *)&local_158);
      pnVar4 = peer->adj_ribs_in;
      prefix_len_00 = (uint8_t)local_158;
      paVar7 = &local_148;
      puVar8 = (undefined8 *)&stack0xfffffffffffffd88;
      for (lVar5 = 0x23; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *(undefined8 *)&paVar7->path_attr;
        paVar7 = (adj_ribs_in_data *)((long)paVar7 + ((ulong)bVar10 * -2 + 1) * 8);
        puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
      }
      pnVar4 = add_prefix<adj_ribs_in_data>
                         (pnVar4,prefix,prefix_len_00,in_stack_fffffffffffffd88,(bool *)&local_150);
      if ((char)local_150 == '\0') {
        peer->route_count = peer->route_count + 1;
      }
      else {
        log<>(DEBUG,"Route updated!");
      }
      iVar9 = iVar9 + iVar6;
      attempt_to_install_bgp_loc_rib(peer,pnVar4);
      bVar3 = true;
    }
    else {
      if (bVar1 < 0x11) {
        prefix = (uint)buff[(long)iVar9 + 2] << 0x10 | (uint)buff[(long)iVar9 + 1] << 0x18;
        iVar6 = 3;
        goto LAB_00112803;
      }
      if (bVar1 < 0x19) {
        prefix = (uint)buff[(long)iVar9 + 3] << 8 |
                 (uint)buff[(long)iVar9 + 2] << 0x10 | (uint)buff[(long)iVar9 + 1] << 0x18;
        iVar6 = 4;
        goto LAB_00112803;
      }
      if (bVar1 < 0x21) {
        uVar2 = *(uint *)(buff + (long)iVar9 + 1);
        prefix = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        iVar6 = 5;
        goto LAB_00112803;
      }
      bVar3 = false;
      log<>(ERROR,"Invalid packet");
    }
    if (!bVar3) {
      return true;
    }
  } while( true );
}

Assistant:

bool bgp_update(bgp_peer* peer,  unsigned char* buff, int entire_length){
    uint16_t unfeasible_routes_length;
    memcpy(&unfeasible_routes_length, &buff[19], 2);
    unfeasible_routes_length = ntohs(unfeasible_routes_length);
    int read_length;

    bgp_update_handle_unfeasible_prefix(peer, buff, unfeasible_routes_length);

    adj_ribs_in_data route_data;
    uint16_t total_path_attribute_length;
    memcpy(&total_path_attribute_length, &buff[19 + 2 + unfeasible_routes_length], 2);
    total_path_attribute_length = ntohs(total_path_attribute_length);

    bgp_update_handle_path_attribute(peer, buff, unfeasible_routes_length, total_path_attribute_length, route_data);

    read_length = 19 + 2 + unfeasible_routes_length + 2 + total_path_attribute_length;

    while(read_length < entire_length){
        uint32_t prefix;
        int prefix_len = buff[read_length];
        if(prefix_len <= 8){
            prefix = buff[read_length + 1]*256*256*256;
            read_length += 2;
        }else if(prefix_len <= 16){
            prefix = buff[read_length + 1]*256*256*256 + buff[read_length + 2]*256*256;
            read_length += 3;
        }else if(prefix_len <= 24){
            prefix = buff[read_length + 1]*256*256*256 + buff[read_length + 2]*256*256 + buff[read_length + 3]*256;
            read_length += 4;
        }else if(prefix_len <= 32){
            prefix = buff[read_length + 1]*256*256*256 + buff[read_length + 2]*256*256 + buff[read_length + 3]*256 + buff[read_length + 4];
            read_length += 5;
        }else{
            log(log_level::ERROR, "Invalid packet");
            break;
        }
        log(log_level::DEBUG, "%s/%d", inet_ntoa(in_addr{.s_addr=ntohl(prefix)}), prefix_len);
        bool is_updated;
        node<adj_ribs_in_data>* added = add_prefix(peer->adj_ribs_in, prefix, prefix_len, route_data, &is_updated);
        if(!is_updated){
            peer->route_count++;
        }else{
            log(log_level::DEBUG, "Route updated!");
        }
        attempt_to_install_bgp_loc_rib(peer, added);
    }
    return true;
}